

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

WildcardUdpPortListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WildcardUdpPortListSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,Token *args_3,Token *args_4)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  TokenKind TVar18;
  undefined1 uVar19;
  NumericTokenFlags NVar20;
  uint32_t uVar21;
  TokenKind TVar22;
  undefined1 uVar23;
  NumericTokenFlags NVar24;
  uint32_t uVar25;
  WildcardUdpPortListSyntax *pWVar26;
  
  pWVar26 = (WildcardUdpPortListSyntax *)allocate(this,0x68,8);
  TVar6 = args->kind;
  uVar7 = args->field_0x2;
  NVar8.raw = (args->numFlags).raw;
  uVar9 = args->rawLen;
  pIVar1 = args->info;
  TVar10 = args_1->kind;
  uVar11 = args_1->field_0x2;
  NVar12.raw = (args_1->numFlags).raw;
  uVar13 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar14 = args_2->kind;
  uVar15 = args_2->field_0x2;
  NVar16.raw = (args_2->numFlags).raw;
  uVar17 = args_2->rawLen;
  pIVar3 = args_2->info;
  TVar18 = args_3->kind;
  uVar19 = args_3->field_0x2;
  NVar20.raw = (args_3->numFlags).raw;
  uVar21 = args_3->rawLen;
  pIVar4 = args_3->info;
  TVar22 = args_4->kind;
  uVar23 = args_4->field_0x2;
  NVar24.raw = (args_4->numFlags).raw;
  uVar25 = args_4->rawLen;
  pIVar5 = args_4->info;
  (pWVar26->super_UdpPortListSyntax).super_SyntaxNode.kind = WildcardUdpPortList;
  (pWVar26->super_UdpPortListSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pWVar26->super_UdpPortListSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pWVar26->openParen).kind = TVar6;
  (pWVar26->openParen).field_0x2 = uVar7;
  (pWVar26->openParen).numFlags = (NumericTokenFlags)NVar8.raw;
  (pWVar26->openParen).rawLen = uVar9;
  (pWVar26->openParen).info = pIVar1;
  (pWVar26->dot).kind = TVar10;
  (pWVar26->dot).field_0x2 = uVar11;
  (pWVar26->dot).numFlags = (NumericTokenFlags)NVar12.raw;
  (pWVar26->dot).rawLen = uVar13;
  (pWVar26->dot).info = pIVar2;
  (pWVar26->star).kind = TVar14;
  (pWVar26->star).field_0x2 = uVar15;
  (pWVar26->star).numFlags = (NumericTokenFlags)NVar16.raw;
  (pWVar26->star).rawLen = uVar17;
  (pWVar26->star).info = pIVar3;
  (pWVar26->closeParen).kind = TVar18;
  (pWVar26->closeParen).field_0x2 = uVar19;
  (pWVar26->closeParen).numFlags = (NumericTokenFlags)NVar20.raw;
  (pWVar26->closeParen).rawLen = uVar21;
  (pWVar26->closeParen).info = pIVar4;
  (pWVar26->semi).kind = TVar22;
  (pWVar26->semi).field_0x2 = uVar23;
  (pWVar26->semi).numFlags = (NumericTokenFlags)NVar24.raw;
  (pWVar26->semi).rawLen = uVar25;
  (pWVar26->semi).info = pIVar5;
  return pWVar26;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }